

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwlock_test.cpp
# Opt level: O0

void __thiscall
SharedMutexTest_TryLockFail_Test<yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::WriterPrefer>_>
::TestBody(SharedMutexTest_TryLockFail_Test<yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::WriterPrefer>_>
           *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_158;
  AssertHelper local_138;
  Message local_130;
  bool local_121;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_;
  type local_100;
  join_thread local_f0;
  join_thread thd;
  undefined1 local_80 [8];
  barrier step;
  SharedMutexTest_TryLockFail_Test<yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::WriterPrefer>_>
  *this_local;
  
  step.mtx_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)this;
  yamc::test::barrier::barrier((barrier *)local_80,2);
  yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::WriterPrefer>::basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::WriterPrefer> *)&thd);
  local_100.mtx = (TypeParam *)&thd;
  local_100.step = (barrier *)local_80;
  yamc::test::join_thread::
  join_thread<SharedMutexTest_TryLockFail_Test<yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::WriterPrefer>>::TestBody()::_lambda()_1_>
            (&local_f0,&local_100);
  yamc::test::barrier::await((barrier *)local_80);
  bVar1 = yamc::alternate::detail::shared_mutex_base<yamc::rwlock::WriterPrefer>::try_lock
                    ((shared_mutex_base<yamc::rwlock::WriterPrefer> *)&thd);
  local_121 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_120,&local_121,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_158,(internal *)local_120,(AssertionResult *)"mtx.try_lock()","true","false",
               in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/rwlock_test.cpp"
               ,0x82,message);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  yamc::test::barrier::await((barrier *)local_80);
  yamc::test::join_thread::~join_thread(&local_f0);
  yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::WriterPrefer>::~basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::WriterPrefer> *)&thd);
  yamc::test::barrier::~barrier((barrier *)local_80);
  return;
}

Assistant:

TYPED_TEST(SharedMutexTest, TryLockFail)
{
  yamc::test::barrier step(2);
  TypeParam mtx;
  // reader-thread
  yamc::test::join_thread thd([&]{
    ASSERT_NO_THROW(mtx.lock_shared());
    step.await();  // b1
    step.await();  // b2
    ASSERT_NO_THROW(mtx.unlock_shared());
  });
  // writer-thread
  {
    step.await();  // b1
    EXPECT_FALSE(mtx.try_lock());
    step.await();  // b2
  }
}